

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Bytes __thiscall Omega_h::each_neq_to<long>(Omega_h *this,Read<long> *a,long b)

{
  void *extraout_RDX;
  Bytes BVar1;
  Write<signed_char> local_d8;
  undefined1 local_c8 [8];
  type_conflict1 f;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<signed_char> c;
  long b_local;
  Read<long> *a_local;
  ulong local_20;
  LO local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  c.shared_alloc_.direct_ptr = (void *)b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<signed_char>::Write((Write<signed_char> *)local_68,(LO)(local_20 >> 3),(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Write<signed_char>::Write((Write<signed_char> *)local_c8,(Write<signed_char> *)local_68);
  Read<long>::Read((Read<long> *)&f.c.shared_alloc_.direct_ptr,(Read<int> *)a);
  f.a.write_.shared_alloc_.direct_ptr = c.shared_alloc_.direct_ptr;
  if (((ulong)local_68 & 1) == 0) {
    local_10 = (LO)*(size_t *)local_68;
  }
  else {
    local_10 = (LO)((ulong)local_68 >> 3);
  }
  parallel_for<Omega_h::each_neq_to<long>(Omega_h::Read<long>,long)::_lambda(int)_1_>
            (local_10,(type_conflict1 *)local_c8,"each_neq_to");
  Write<signed_char>::Write(&local_d8,(Write<signed_char> *)local_68);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_d8);
  Write<signed_char>::~Write(&local_d8);
  each_neq_to<long>(Omega_h::Read<long>,long)::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_c8);
  Write<signed_char>::~Write((Write<signed_char> *)local_68);
  BVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  BVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar1.write_.shared_alloc_;
}

Assistant:

Bytes each_neq_to(Read<T> a, T b) {
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] != b); };
  parallel_for(c.size(), f, "each_neq_to");
  return c;
}